

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O0

void __thiscall Nova::Driver<float,_3>::Initialize(Driver<float,_3> *this)

{
  float fVar1;
  Driver<float,_3> *this_local;
  
  if ((this->example->restart & 1U) == 0) {
    this->current_frame = this->example->first_frame;
  }
  else {
    this->current_frame = this->example->restart_frame;
    (*this->_vptr_Driver[6])(this,(ulong)(uint)this->current_frame);
  }
  this->output_number = this->current_frame;
  fVar1 = Example<float,_3>::Time_At_Frame(this->example,this->current_frame);
  this->time = fVar1;
  this->example->output_number = this->output_number;
  this->example->current_frame = this->current_frame;
  return;
}

Assistant:

void Driver<T,d>::
Initialize()
{
    if(example.restart){current_frame=example.restart_frame;Read_Time(current_frame);}
    else current_frame=example.first_frame;
    output_number=current_frame;
    time=example.Time_At_Frame(current_frame);
    example.output_number=output_number;
    example.current_frame=current_frame;
}